

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O3

bool __thiscall
QSocks5PasswordAuthenticator::beginAuthenticate
          (QSocks5PasswordAuthenticator *this,QTcpSocket *socket,bool *completed)

{
  char *__dest;
  char *pcVar1;
  qsizetype qVar2;
  long lVar3;
  undefined1 *puVar4;
  long in_FS_OFFSET;
  QByteArray local_88;
  QArrayData *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QArrayData *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *completed = false;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QString::toLatin1_helper((QString *)&local_48);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QString::toLatin1_helper((QString *)&local_68);
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&local_88,(longlong)(local_38 + (long)local_58 + 3),'\0');
  if ((&(local_88.d.d)->super_QArrayData == (QArrayData *)0x0) ||
     (1 < ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)&local_88,(AllocationOption)local_88.d.size);
  }
  pcVar1 = local_88.d.ptr;
  *local_88.d.ptr = '\x01';
  local_88.d.ptr[1] = (char)local_38;
  __dest = local_88.d.ptr + 2;
  if ((local_48 == (QArrayData *)0x0) ||
     (1 < (local_48->ref_)._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)&local_48,(AllocationOption)local_38);
  }
  memcpy(__dest,puStack_40,(size_t)local_38);
  lVar3 = (long)local_38 << 0x20;
  pcVar1[lVar3 + 0x200000000 >> 0x20] = (char)local_58;
  if ((local_68 == (QArrayData *)0x0) ||
     (1 < (local_68->ref_)._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)&local_68,(AllocationOption)local_58);
  }
  memcpy(pcVar1 + (lVar3 + 0x300000000 >> 0x20),puStack_60,(size_t)local_58);
  puVar4 = (undefined1 *)QIODevice::write((QByteArray *)socket);
  qVar2 = local_88.d.size;
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,1,0x10);
    }
  }
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return puVar4 == (undefined1 *)qVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QSocks5PasswordAuthenticator::beginAuthenticate(QTcpSocket *socket, bool *completed)
{
    *completed = false;
    QByteArray uname = userName.toLatin1();
    QByteArray passwd = password.toLatin1();
    QByteArray dataBuf(3 + uname.size() + passwd.size(), 0);
    char *buf = dataBuf.data();
    int pos = 0;
    buf[pos++] = S5_PASSWORDAUTH_VERSION;
    buf[pos++] = uname.size();
    memcpy(&buf[pos], uname.data(), uname.size());
    pos += uname.size();
    buf[pos++] = passwd.size();
    memcpy(&buf[pos], passwd.data(), passwd.size());
    return socket->write(dataBuf) == dataBuf.size();
}